

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloud.c
# Opt level: O1

int Cloud_DagCollect_rec(CloudManager *dd,CloudNode *n,int *pCounter)

{
  uint uVar1;
  CloudNode **ppCVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  uVar1 = n->v;
  iVar5 = 0;
  if ((uVar1 >> 0x1c & 1) == 0) {
    n->v = uVar1 | 0x10000000;
    if (uVar1 == 0xfffffff) {
      ppCVar2 = dd->ppNodes;
      iVar5 = *pCounter;
      *pCounter = iVar5 + 1;
      ppCVar2[iVar5] = n;
      iVar5 = 1;
    }
    else {
      iVar3 = Cloud_DagCollect_rec(dd,n->t,pCounter);
      iVar4 = Cloud_DagCollect_rec(dd,(CloudNode *)((ulong)n->e & 0xfffffffffffffffe),pCounter);
      ppCVar2 = dd->ppNodes;
      iVar5 = *pCounter;
      *pCounter = iVar5 + 1;
      ppCVar2[iVar5] = n;
      iVar5 = iVar4 + iVar3 + 1;
    }
  }
  return iVar5;
}

Assistant:

static int Cloud_DagCollect_rec( CloudManager * dd, CloudNode * n, int * pCounter )
{
    int tval, eval;
    if ( cloudNodeIsMarked(n) )
        return 0;
    // set visited flag
    cloudNodeMark(n);
    if ( cloudIsConstant(n) )
    {
        dd->ppNodes[(*pCounter)++] = n;
        return 1;
    }
    tval = Cloud_DagCollect_rec( dd, cloudT(n), pCounter );
    eval = Cloud_DagCollect_rec( dd, Cloud_Regular(cloudE(n)), pCounter );
    dd->ppNodes[(*pCounter)++] = n;
    return tval + eval + 1;

}